

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadBytes
          (BinaryReader *this,void **out_data,Address *out_data_size,char *desc)

{
  ulong uVar1;
  Offset OVar2;
  Result RVar3;
  Enum EVar4;
  uint32_t data_size;
  uint32_t local_2c;
  
  local_2c = 0;
  RVar3 = ReadU32Leb128(this,&local_2c,"data size");
  EVar4 = Error;
  if (RVar3.enum_ != Error) {
    OVar2 = (this->state_).offset;
    uVar1 = OVar2 + local_2c;
    if (this->read_end_ < uVar1) {
      PrintError(this,"unable to read data: %s",desc);
    }
    else {
      *out_data = (this->state_).data + OVar2;
      (this->state_).offset = uVar1;
      *out_data_size = (ulong)local_2c;
      EVar4 = Ok;
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReader::ReadBytes(const void** out_data,
                               Address* out_data_size,
                               const char* desc) {
  uint32_t data_size = 0;
  CHECK_RESULT(ReadU32Leb128(&data_size, "data size"));
  CHECK_RESULT(ReadBytesWithSize(out_data, data_size, desc));
  *out_data_size = data_size;
  return Result::Ok;
}